

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O0

void __thiscall FIX::SocketServer::SocketServer(SocketServer *this,int timeout)

{
  int timeout_local;
  SocketServer *this_local;
  
  std::
  map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
  ::map(&this->m_socketToInfo);
  std::
  map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
  ::map(&this->m_portToInfo);
  SocketMonitor::SocketMonitor(&this->m_monitor,timeout);
  return;
}

Assistant:

SocketServer::SocketServer( int timeout )
: m_monitor( timeout ) {}